

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::AddRow(Matrix *this,int first_row,int second_row,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  bool local_4c;
  Fraction local_48;
  long local_40;
  Fraction local_38;
  
  local_4c = false;
  local_38 = coefficient;
  Fraction::Fraction(&local_48,0);
  bVar2 = operator==(&local_38,&local_48);
  if (!bVar2) {
    if (this->m_ < 1) {
      local_4c = false;
    }
    else {
      lVar4 = 0;
      local_40 = (long)first_row * 3;
      lVar3 = 0;
      local_4c = false;
      do {
        lVar1 = *(long *)&(this->elements_).
                          super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[second_row].
                          super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data;
        Fraction::Fraction(&local_48,0);
        bVar2 = operator!=((Fraction *)(lVar1 + lVar4),&local_48);
        if (bVar2) {
          local_48 = operator*(&local_38,
                               (Fraction *)
                               (*(long *)&(this->elements_).
                                          super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[second_row].
                                          super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                                          _M_impl.super__Vector_impl_data + lVar4));
          Fraction::operator+=
                    ((Fraction *)
                     (*(long *)((long)&(((this->elements_).
                                         super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                       _M_impl.super__Vector_impl_data + local_40 * 8) + lVar4),
                     &local_48);
          local_4c = true;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 8;
      } while (lVar3 < this->m_);
    }
  }
  return local_4c;
}

Assistant:

bool Matrix::AddRow(int first_row, int second_row, Fraction coefficient) {
  if (coefficient == 0) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[second_row][column] != 0) {
      result = true;
      elements_[first_row][column] += coefficient * elements_[second_row][column];
    }
  }

  return result;
}